

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxylogger.cpp
# Opt level: O2

void __thiscall MyClass::MyClass(MyClass *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"TESTPROXY",&local_31);
  liblogger::ProxyLogger::ProxyLogger(&this->super_ProxyLogger,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

MyClass() :
            ProxyLogger("TESTPROXY")
        {

        }